

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void tcd_makelayer(opj_tcd_t *tcd,int layno,double thresh,int final)

{
  opj_tcd_cblk_enc_t *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  opj_tcd_tile_t *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_tcd_resolution_t *poVar7;
  opj_tcd_precinct_t *poVar8;
  opj_tcd_cblk_enc_t *poVar9;
  opj_tcd_pass_t *poVar10;
  uint uVar11;
  int iVar12;
  opj_tcd_layer_t *poVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  double dVar26;
  long local_b0;
  
  poVar5 = tcd->tcd_tile;
  poVar5->distolayer[layno] = 0.0;
  iVar2 = poVar5->numcomps;
  if (0 < (long)iVar2) {
    poVar6 = poVar5->comps;
    lVar19 = 0;
    do {
      lVar17 = (long)poVar6[lVar19].numresolutions;
      if (0 < lVar17) {
        poVar7 = poVar6[lVar19].resolutions;
        lVar15 = 0;
        do {
          iVar3 = poVar7[lVar15].numbands;
          if (0 < (long)iVar3) {
            uVar16 = poVar7[lVar15].ph * poVar7[lVar15].pw;
            local_b0 = 0;
            do {
              if (0 < (int)uVar16) {
                poVar8 = poVar7[lVar15].bands[local_b0].precincts;
                uVar14 = 0;
                do {
                  uVar11 = poVar8[uVar14].ch * poVar8[uVar14].cw;
                  if (0 < (int)uVar11) {
                    uVar20 = 0;
                    do {
                      poVar9 = poVar8[uVar14].cblks.enc;
                      poVar1 = poVar9 + uVar20;
                      if (layno == 0) {
                        poVar1->numpassesinlayers = 0;
                      }
                      iVar4 = poVar1->numpassesinlayers;
                      lVar25 = (long)iVar4;
                      iVar24 = iVar4;
                      if (iVar4 < poVar1->totalpasses) {
                        poVar10 = poVar1->passes;
                        pdVar18 = &poVar10[lVar25].distortiondec;
                        lVar22 = poVar1->totalpasses - lVar25;
                        iVar23 = iVar4;
                        iVar12 = iVar4;
                        do {
                          iVar12 = iVar12 + 1;
                          iVar21 = ((opj_tcd_pass_t *)(pdVar18 + -1))->rate;
                          if (iVar23 == 0) {
                            dVar26 = *pdVar18;
                          }
                          else {
                            iVar21 = iVar21 - poVar10[(long)iVar23 + -1].rate;
                            dVar26 = *pdVar18 - poVar10[(long)iVar23 + -1].distortiondec;
                          }
                          if (iVar21 == 0) {
                            iVar24 = iVar12;
                            if (dVar26 == 0.0) {
                              iVar24 = iVar23;
                            }
                          }
                          else {
                            iVar24 = iVar23;
                            if (thresh <= dVar26 / (double)iVar21) {
                              iVar24 = iVar12;
                            }
                          }
                          pdVar18 = pdVar18 + 3;
                          lVar22 = lVar22 + -1;
                          iVar23 = iVar24;
                        } while (lVar22 != 0);
                      }
                      poVar13 = poVar9[uVar20].layers + layno;
                      poVar13->numpasses = iVar24 - iVar4;
                      if (iVar24 - iVar4 == 0) {
                        poVar13->disto = 0.0;
                      }
                      else {
                        iVar12 = iVar24 + -1;
                        poVar10 = poVar1->passes;
                        if (iVar4 == 0) {
                          poVar13->len = poVar10[iVar12].rate;
                          poVar13->data = poVar1->data;
                          dVar26 = poVar10[iVar12].distortiondec;
                        }
                        else {
                          iVar4 = poVar10[lVar25 + -1].rate;
                          poVar13->len = poVar10[iVar12].rate - iVar4;
                          poVar13->data = poVar1->data + iVar4;
                          dVar26 = poVar10[iVar12].distortiondec -
                                   poVar10[lVar25 + -1].distortiondec;
                        }
                        poVar13->disto = (OPJ_FLOAT64)dVar26;
                        poVar5->distolayer[layno] = dVar26 + poVar5->distolayer[layno];
                        if (final != 0) {
                          poVar1->numpassesinlayers = iVar24;
                        }
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != uVar11);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar16);
              }
              local_b0 = local_b0 + 1;
            } while (local_b0 != iVar3);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar17);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar2);
  }
  return;
}

Assistant:

void tcd_makelayer(opj_tcd_t *tcd, int layno, double thresh, int final) {
	int compno, resno, bandno, precno, cblkno, passno;
	
	opj_tcd_tile_t *tcd_tile = tcd->tcd_tile;

	tcd_tile->distolayer[layno] = 0;	/* fixed_quality */
	
	for (compno = 0; compno < tcd_tile->numcomps; compno++) {
		opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			for (bandno = 0; bandno < res->numbands; bandno++) {
				opj_tcd_band_t *band = &res->bands[bandno];
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
						opj_tcd_layer_t *layer = &cblk->layers[layno];
						
						int n;
						if (layno == 0) {
							cblk->numpassesinlayers = 0;
						}
						n = cblk->numpassesinlayers;
						for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
							int dr;
							double dd;
							opj_tcd_pass_t *pass = &cblk->passes[passno];
							if (n == 0) {
								dr = pass->rate;
								dd = pass->distortiondec;
							} else {
								dr = pass->rate - cblk->passes[n - 1].rate;
								dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
							}
							if (!dr) {
								if (dd != 0)
									n = passno + 1;
								continue;
							}
							if (dd / dr >= thresh)
								n = passno + 1;
						}
						layer->numpasses = n - cblk->numpassesinlayers;
						
						if (!layer->numpasses) {
							layer->disto = 0;
							continue;
						}
						if (cblk->numpassesinlayers == 0) {
							layer->len = cblk->passes[n - 1].rate;
							layer->data = cblk->data;
							layer->disto = cblk->passes[n - 1].distortiondec;
						} else {
							layer->len = cblk->passes[n - 1].rate -	cblk->passes[cblk->numpassesinlayers - 1].rate;
							layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
							layer->disto = cblk->passes[n - 1].distortiondec - cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
						}
						
						tcd_tile->distolayer[layno] += layer->disto;	/* fixed_quality */
						
						if (final)
							cblk->numpassesinlayers = n;
					}
				}
			}
		}
	}
}